

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_context.cpp
# Opt level: O2

void __thiscall duckdb::ThreadContext::ThreadContext(ThreadContext *this,ClientContext *context)

{
  TransactionContext *this_00;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var1;
  LoggingContext context_00;
  optional_idx oVar2;
  optional_idx oVar3;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var4;
  connection_t index;
  MetaTransaction *pMVar5;
  idx_t iVar6;
  DatabaseInstance *this_01;
  LogManager *pLVar7;
  optional_idx oVar8;
  optional_idx oVar9;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_70;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  optional_idx local_38;
  
  OperatorProfiler::OperatorProfiler(&this->profiler,context);
  local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->logger;
  (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = (Logger *)0x0;
  local_60 = this;
  index = ClientContext::GetConnectionId(context);
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff90,index);
  oVar2.index = (idx_t)local_70._M_head_impl;
  this_00 = &context->transaction;
  if ((context->transaction).current_transaction.
      super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t.
      super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
      .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl ==
      (MetaTransaction *)0x0) {
    oVar8.index = 0xffffffffffffffff;
    oVar9.index = oVar8.index;
  }
  else {
    pMVar5 = TransactionContext::ActiveTransaction(this_00);
    optional_idx::optional_idx
              ((optional_idx *)&stack0xffffffffffffff90,pMVar5->global_transaction_id);
    oVar8.index = (idx_t)local_70._M_head_impl;
    iVar6 = TransactionContext::GetActiveQuery(this_00);
    optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff90,iVar6);
    oVar9.index = (idx_t)local_70._M_head_impl;
  }
  iVar6 = TaskScheduler::GetEstimatedCPUId();
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff90,iVar6);
  oVar3.index = (idx_t)local_70._M_head_impl;
  if ((context->transaction).current_transaction.
      super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t.
      super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
      .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl !=
      (MetaTransaction *)0x0) {
    iVar6 = TransactionContext::GetActiveQuery(this_00);
    optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff90,iVar6);
    oVar8.index = (idx_t)local_70._M_head_impl;
  }
  this_01 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  pLVar7 = DatabaseInstance::GetLogManager(this_01);
  local_58 = '\x1e';
  uStack_50 = oVar3.index;
  local_48 = oVar2.index;
  context_00._1_7_ = uStack_57;
  context_00.scope = 0x1e;
  context_00.thread_id.index = oVar3.index;
  context_00.connection_id.index = oVar2.index;
  context_00.transaction_id.index = oVar8.index;
  context_00.query_id.index = oVar9.index;
  uStack_40 = oVar8.index;
  local_38.index = oVar9.index;
  LogManager::CreateLogger((LogManager *)&stack0xffffffffffffff90,context_00,SUB81(pLVar7,0),true);
  _Var4._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (Logger *)0x0;
  _Var1._M_head_impl =
       (((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_> *)
        &(local_68._M_pi)->_vptr__Sp_counted_base)->_M_t).
       super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  (((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_> *)
   &(local_68._M_pi)->_vptr__Sp_counted_base)->_M_t).
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (Logger *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Logger + 8))();
    if (local_70._M_head_impl != (Logger *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

ThreadContext::ThreadContext(ClientContext &context) : profiler(context) {
	LoggingContext log_context(LogContextScope::THREAD);

	log_context.connection_id = context.GetConnectionId();
	if (context.transaction.HasActiveTransaction()) {
		log_context.transaction_id = context.transaction.ActiveTransaction().global_transaction_id;
		log_context.query_id = context.transaction.GetActiveQuery();
	}

	log_context.thread_id = TaskScheduler::GetEstimatedCPUId();
	if (context.transaction.HasActiveTransaction()) {
		log_context.transaction_id = context.transaction.GetActiveQuery();
	}
	logger = context.db->GetLogManager().CreateLogger(log_context, true);
}